

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O3

void __thiscall summarycalc::loadsummaryxref(summarycalc *this,string *filename)

{
  ulong __new_size;
  pointer pcVar1;
  vector<int,_std::allocator<int>_> *this_00;
  int iVar2;
  long *plVar3;
  FILE *__stream;
  coverage_id_or_output_id_to_Summary_id *pcVar4;
  size_t sVar5;
  pointer piVar6;
  undefined8 extraout_RAX;
  long *plVar7;
  long lVar8;
  int i;
  long lVar9;
  string file;
  fmsummaryxref s;
  undefined1 local_90 [32];
  undefined8 local_70;
  long local_68;
  long local_60;
  long lStack_58;
  value_type local_50;
  int iStack_4c;
  undefined1 local_40 [16];
  
  local_90._0_8_ = local_90 + 0x10;
  pcVar1 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,pcVar1,pcVar1 + filename->_M_string_length);
  if ((this->inputpath_)._M_string_length != 0) {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)local_90);
    plVar3 = (long *)std::__cxx11::string::replace
                               ((ulong)&local_50,0,(char *)0x0,
                                (ulong)(this->inputpath_)._M_dataplus._M_p);
    plVar7 = plVar3 + 2;
    if ((long *)*plVar3 == plVar7) {
      local_60 = *plVar7;
      lStack_58 = plVar3[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar7;
      local_70 = (long *)*plVar3;
    }
    local_68 = plVar3[1];
    *plVar3 = (long)plVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_90,(string *)&local_70);
    if (local_70 != &local_60) {
      operator_delete(local_70);
    }
    if ((undefined1 *)CONCAT44(iStack_4c,local_50) != local_40) {
      operator_delete((undefined1 *)CONCAT44(iStack_4c,local_50));
    }
  }
  __stream = fopen((char *)local_90._0_8_,"rb");
  if (__stream != (FILE *)0x0) {
    lVar9 = 0;
    do {
      if (this->fout[lVar9] != (FILE *)0x0) {
        pcVar4 = (coverage_id_or_output_id_to_Summary_id *)operator_new(0x18);
        (pcVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        (pcVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        (pcVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        this->co_to_s_[lVar9] = pcVar4;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 10);
    sVar5 = fread(&local_70,0xc,1,__stream);
    if ((int)sVar5 != 0) {
      do {
        lVar9 = (long)(int)local_68;
        if (9 < lVar9) {
          loadsummaryxref();
          goto LAB_001034c6;
        }
        if (this->fout[lVar9] != (FILE *)0x0) {
          iVar2 = local_70._4_4_;
          if (local_70._4_4_ < this->min_summary_id_[lVar9]) {
            this->min_summary_id_[lVar9] = local_70._4_4_;
          }
          if (this->max_summary_id_[lVar9] < local_70._4_4_) {
            this->max_summary_id_[lVar9] = local_70._4_4_;
          }
          this_00 = this->co_to_s_[lVar9];
          piVar6 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar8 = (long)(int)local_70;
          __new_size = lVar8 + 1;
          if ((ulong)((long)(this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar6 >> 2) < __new_size) {
            local_50 = 0;
            std::vector<int,_std::allocator<int>_>::resize(this_00,__new_size,&local_50);
            piVar6 = (this->co_to_s_[lVar9]->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
          }
          piVar6[lVar8] = iVar2;
        }
        sVar5 = fread(&local_70,0xc,1,__stream);
      } while ((int)sVar5 != 0);
    }
    fclose(__stream);
    if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
      operator_delete((void *)local_90._0_8_);
    }
    return;
  }
LAB_001034c6:
  loadsummaryxref((summarycalc *)local_90);
  if ((undefined1 *)CONCAT44(iStack_4c,local_50) != local_40) {
    operator_delete((undefined1 *)CONCAT44(iStack_4c,local_50));
  }
  if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
    operator_delete((void *)local_90._0_8_);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void summarycalc::loadsummaryxref(const std::string& filename)
{
	std::string file = filename;
	if (inputpath_.length() > 0) {
		file = inputpath_ + file.substr(5);
	}
	FILE *fin = fopen(file.c_str(), "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL: %s: Error opening file %s\n", __func__, file.c_str());
		::exit(-1);
	}

	init_o_to_s();

	fmsummaryxref s;
	int i = (int)fread(&s, sizeof(fmsummaryxref), 1, fin);
	while (i != 0) {
		if (s.summaryset_id > 9) {
			fprintf(stderr, "FATAL: %s: Invalid summaryset id  %d found in %s\n", __func__, s.summaryset_id, file.c_str());
			::exit(-1);
		}
		if (fout[s.summaryset_id] != nullptr) {
			if (s.summary_id < min_summary_id_[s.summaryset_id]) min_summary_id_[s.summaryset_id] = s.summary_id;
			if (s.summary_id > max_summary_id_[s.summaryset_id]) max_summary_id_[s.summaryset_id] = s.summary_id;
			if ( (*co_to_s_[s.summaryset_id]).size() < (size_t)(s.output_id + 1)) (*co_to_s_[s.summaryset_id]).resize(s.output_id + 1, 0);
			(*co_to_s_[s.summaryset_id])[s.output_id] = s.summary_id ;
		}
		i = (int) fread(&s, sizeof(fmsummaryxref), 1, fin);
	}

		fclose(fin);
}